

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

bool __thiscall AbstractModuleClient::unsubToTimestamps(AbstractModuleClient *this)

{
  network_pimpl *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  network_pimpl::setTimestamp_endpoint(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *(undefined4 *)((long)&in_RDI[1].address.field_2 + 8) = 0;
  if (in_RDI[1].endpoint.field_2._M_allocated_capacity != 0) {
    zsock_destroy_checked
              ((zsock_t **)&in_RDI[1].endpoint.field_2._M_allocated_capacity,
               "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/AbstractModuleClient.cpp"
               ,0x222);
    std::__cxx11::string::operator=((string *)(in_RDI[1].endpoint.field_2._M_local_buf + 8),"");
  }
  return true;
}

Assistant:

bool AbstractModuleClient::unsubToTimestamps(){
    state->setTimestamp_endpoint("");
    lastTimestamp = 0;
    if(timestampsub){
        zsock_destroy(&timestampsub);
        timestampaddress = "";
        return true;
    }
    return true;
}